

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O3

stb_dirtree2 * stb_dirtree2_from_files_relative(char *src,char **filelist,int count)

{
  char **filelist_00;
  int iVar1;
  int iVar2;
  size_t sVar3;
  long lVar4;
  char *pcVar5;
  stb_dirtree2 *p;
  char *pcVar6;
  stb_dirtree2 *psVar7;
  char cVar8;
  char **ppcVar9;
  char *pcVar10;
  stb_dirtree2 **ppsVar11;
  long lVar12;
  ulong uVar13;
  char **files;
  char **descendents;
  char buffer1 [1024];
  char buffer2 [1024];
  char **local_858;
  long local_850;
  char **local_848;
  long local_840;
  char local_838 [1023];
  char acStack_439 [1033];
  
  sVar3 = strlen(src);
  p = (stb_dirtree2 *)0x0;
  local_848 = (char **)0x0;
  local_858 = (char **)0x0;
  if (0 < count) {
    ppcVar9 = (char **)0x0;
    uVar13 = 0;
    do {
      pcVar6 = filelist[uVar13];
      iVar1 = stb_dir_is_prefix(src,(int)sVar3,pcVar6);
      if (iVar1 != 0) {
        if ((ppcVar9 == (char **)0x0) || (*(int *)((long)ppcVar9 + -0xc) <= *(int *)(ppcVar9 + -2)))
        {
          stb__arr_addlen_(&local_848,8,1);
          ppcVar9 = local_848;
        }
        else {
          *(int *)(ppcVar9 + -2) = *(int *)(ppcVar9 + -2) + 1;
        }
        if (ppcVar9 == (char **)0x0) {
          lVar4 = 0;
        }
        else {
          lVar4 = (long)*(int *)(ppcVar9 + -2);
        }
        ppcVar9[lVar4 + -1] = pcVar6;
      }
      filelist_00 = local_848;
      uVar13 = uVar13 + 1;
    } while ((uint)count != uVar13);
    if (local_848 == (char **)0x0) {
      p = (stb_dirtree2 *)0x0;
    }
    else {
      if ((int)sVar3 == 0) {
        uVar13 = (ulong)(**local_848 == '\\' || **local_848 == '/');
      }
      else {
        uVar13 = (long)((sVar3 << 0x20) + 0x100000000) >> 0x20;
      }
      iVar1 = *(int *)(local_848 + -2);
      if (0 < iVar1) {
        local_850 = uVar13 + 1;
        iVar2 = 0;
        do {
          pcVar6 = filelist_00[iVar2];
          cVar8 = pcVar6[uVar13];
          if (cVar8 != '\0') {
            pcVar5 = pcVar6 + local_850;
            do {
              if ((cVar8 == '/') || (cVar8 == '\\')) {
                iVar2 = iVar2 + 1;
                goto LAB_0015389a;
              }
              cVar8 = *pcVar5;
              pcVar5 = pcVar5 + 1;
            } while (cVar8 != '\0');
          }
          if ((local_858 == (char **)0x0) ||
             (*(int *)((long)local_858 + -0xc) <= *(int *)(local_858 + -2))) {
            stb__arr_addlen_(&local_858,8,1);
          }
          else {
            *(int *)(local_858 + -2) = *(int *)(local_858 + -2) + 1;
          }
          local_858[(long)*(int *)(local_858 + -2) + -1] = pcVar6;
          iVar1 = *(int *)(filelist_00 + -2);
          filelist_00[iVar2] = filelist_00[(long)iVar1 + -1];
          iVar1 = iVar1 + -1;
          *(int *)(filelist_00 + -2) = iVar1;
LAB_0015389a:
        } while (iVar2 < iVar1);
      }
      p = (stb_dirtree2 *)malloc(0x28);
      p->files = local_858;
      p->subdirs = (stb_dirtree2 **)0x0;
      pcVar6 = strdup(src);
      p->fullpath = pcVar6;
      cVar8 = *pcVar6;
      if (cVar8 != '\0') {
        pcVar5 = (char *)0x0;
        pcVar10 = pcVar6;
        do {
          if (cVar8 == '\\') {
            pcVar5 = pcVar10;
          }
          if (cVar8 == '/') {
            pcVar5 = pcVar10;
          }
          cVar8 = pcVar10[1];
          pcVar10 = pcVar10 + 1;
        } while (cVar8 != '\0');
        if (pcVar5 != (char *)0x0) {
          pcVar6 = pcVar5 + 1;
        }
      }
      p->relpath = pcVar6;
      stb__strcmpoffset = 0;
      qsort(filelist_00,(long)iVar1,8,stb__qsort_stricmp);
      local_838[0] = '\0';
      iVar1 = *(int *)(filelist_00 + -2);
      if (iVar1 < 1) {
        iVar1 = 0;
      }
      else {
        local_850 = (uVar13 << 0x20) + 0x100000000;
        local_840 = uVar13 + 1;
        ppsVar11 = (stb_dirtree2 **)0x0;
        pcVar6 = acStack_439 + 1;
        lVar4 = 0;
        do {
          pcVar5 = filelist_00[lVar4];
          cVar8 = pcVar5[uVar13];
          if (cVar8 == '\0') {
LAB_00153aa8:
            __assert_fail("t",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                          ,0x1820,
                          "stb_dirtree2 *stb_dirtree2_from_files_relative(char *, char **, int)");
          }
          pcVar10 = pcVar5 + local_840;
          lVar12 = local_850;
          while ((cVar8 != '/' && (cVar8 != '\\'))) {
            cVar8 = *pcVar10;
            lVar12 = lVar12 + 0x100000000;
            pcVar10 = pcVar10 + 1;
            if (cVar8 == '\0') goto LAB_00153aa8;
          }
          strncpy(pcVar6,pcVar5,lVar12 >> 0x20);
          acStack_439[lVar12 >> 0x20] = '\0';
          iVar2 = strcasecmp(local_838,pcVar6);
          if (iVar2 != 0) {
            psVar7 = stb_dirtree2_from_files_relative(pcVar6,filelist_00,iVar1);
            if (psVar7 == (stb_dirtree2 *)0x0) {
              __assert_fail("t != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                            ,0x1824,
                            "stb_dirtree2 *stb_dirtree2_from_files_relative(char *, char **, int)");
            }
            strcpy(local_838,pcVar6);
            if ((ppsVar11 == (stb_dirtree2 **)0x0) ||
               (*(int *)((long)ppsVar11 + -0xc) <= *(int *)(ppsVar11 + -2))) {
              stb__arr_addlen_((void **)p,8,1);
              ppsVar11 = p->subdirs;
            }
            else {
              *(int *)(ppsVar11 + -2) = *(int *)(ppsVar11 + -2) + 1;
            }
            if (ppsVar11 == (stb_dirtree2 **)0x0) {
              lVar12 = 0;
            }
            else {
              lVar12 = (long)*(int *)(ppsVar11 + -2);
            }
            ppsVar11[lVar12 + -1] = psVar7;
            iVar1 = *(int *)(filelist_00 + -2);
          }
          lVar4 = lVar4 + 1;
        } while (lVar4 < iVar1);
        if (p->subdirs == (stb_dirtree2 **)0x0) {
          iVar1 = 0;
        }
        else {
          iVar1 = *(int *)(p->subdirs + -2);
        }
      }
      p->num_subdir = iVar1;
      p->weight = 0.0;
    }
  }
  return p;
}

Assistant:

stb_dirtree2 *stb_dirtree2_from_files_relative(char *src, char **filelist, int count)
{
   char buffer1[1024];
   int i;
   int dlen = strlen(src), elen;
   stb_dirtree2 *d;
   char ** descendents = NULL;
   char ** files = NULL;
   char *s;
   if (!count) return NULL;
   // first find all the ones that belong here... note this is will take O(NM) with N files and M subdirs
   for (i=0; i < count; ++i) {
      if (stb_dir_is_prefix(src, dlen, filelist[i])) {
         stb_arr_push(descendents, filelist[i]);
      }
   }
   if (descendents == NULL)
      return NULL;
   elen = dlen;
   // skip a leading slash
   if (elen == 0 && (descendents[0][0] == '/' || descendents[0][0] == '\\'))
      ++elen;
   else if (elen)
      ++elen;
   // now extract all the ones that have their root here
   for (i=0; i < stb_arr_len(descendents);) {
      if (!stb_strchr2(descendents[i]+elen, '/', '\\')) {
         stb_arr_push(files, descendents[i]);
         descendents[i] = descendents[stb_arr_len(descendents)-1];
         stb_arr_pop(descendents);
      } else
         ++i;
   }
   // now create a record
   d = (stb_dirtree2 *) malloc(sizeof(*d));
   d->files = files;
   d->subdirs = NULL;
   d->fullpath = strdup(src);
   s = stb_strrchr2(d->fullpath, '/', '\\');
   if (s)
      ++s;
   else
      s = d->fullpath;
   d->relpath = s;
   // now create the children
   qsort(descendents, stb_arr_len(descendents), sizeof(char *), stb_qsort_stricmp(0));
   buffer1[0] = 0;
   for (i=0; i < stb_arr_len(descendents); ++i) {
      char buffer2[1024];
      char *s = descendents[i] + elen, *t;
      t = stb_strchr2(s, '/', '\\');
      assert(t);
      stb_strncpy(buffer2, descendents[i], t-descendents[i]+1);
      if (stb_stricmp(buffer1, buffer2)) {
         stb_dirtree2 *t = stb_dirtree2_from_files_relative(buffer2, descendents, stb_arr_len(descendents));
         assert(t != NULL);
         strcpy(buffer1, buffer2);
         stb_arr_push(d->subdirs, t);
      }
   }
   d->num_subdir = stb_arr_len(d->subdirs);
   d->weight = 0;
   return d;
}